

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t validation_layer::zeEventPoolCloseIpcHandle(ze_event_pool_handle_t hEventPool)

{
  Logger *this;
  code *pcVar1;
  long *plVar2;
  long lVar3;
  ze_result_t result;
  ze_result_t zVar4;
  size_t i;
  long lVar5;
  long lVar6;
  size_t i_1;
  allocator local_51;
  string local_50;
  
  lVar3 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeEventPoolCloseIpcHandle(hEventPool)",&local_51);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar1 = *(code **)(lVar3 + 0x480);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(lVar3 + 0xd38) - *(long *)(lVar3 + 0xd30) >> 3;
    lVar5 = 0;
    do {
      if (lVar6 == lVar5) {
        if ((*(char *)(lVar3 + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeEventPoolCloseIpcHandlePrologue
                               (*(ZEHandleLifetimeValidation **)(lVar3 + 0xd48),hEventPool),
           result == ZE_RESULT_SUCCESS)) {
          zVar4 = (*pcVar1)(hEventPool);
          lVar5 = 0;
          goto LAB_0014da01;
        }
        break;
      }
      plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar2 + 0x430))(plVar2,hEventPool);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_0014da2c;
  while( true ) {
    plVar2 = (long *)**(undefined8 **)(*(long *)(lVar3 + 0xd30) + lVar5 * 8);
    result = (**(code **)(*plVar2 + 0x438))(plVar2,hEventPool,zVar4);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_0014da01:
    result = zVar4;
    if (lVar6 == lVar5) break;
  }
LAB_0014da2c:
  logAndPropagateResult("zeEventPoolCloseIpcHandle",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolCloseIpcHandle(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object
        )
    {
        context.logger->log_trace("zeEventPoolCloseIpcHandle(hEventPool)");

        auto pfnCloseIpcHandle = context.zeDdiTable.EventPool.pfnCloseIpcHandle;

        if( nullptr == pfnCloseIpcHandle )
            return logAndPropagateResult("zeEventPoolCloseIpcHandle", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolCloseIpcHandlePrologue( hEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolCloseIpcHandle", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeEventPoolCloseIpcHandlePrologue( hEventPool );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolCloseIpcHandle", result);
        }

        auto driver_result = pfnCloseIpcHandle( hEventPool );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeEventPoolCloseIpcHandleEpilogue( hEventPool ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeEventPoolCloseIpcHandle", result);
        }

        return logAndPropagateResult("zeEventPoolCloseIpcHandle", driver_result);
    }